

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_tls_read_group(mbedtls_ecp_group *grp,uchar **buf,size_t len)

{
  int iVar1;
  mbedtls_ecp_group_id grp_id;
  mbedtls_ecp_group_id local_c;
  
  iVar1 = mbedtls_ecp_tls_read_group_id(&local_c,buf,len);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_group_load(grp,local_c);
  return iVar1;
}

Assistant:

int mbedtls_ecp_tls_read_group( mbedtls_ecp_group *grp,
                                const unsigned char **buf, size_t len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;
    ECP_VALIDATE_RET( grp  != NULL );
    ECP_VALIDATE_RET( buf  != NULL );
    ECP_VALIDATE_RET( *buf != NULL );

    if( ( ret = mbedtls_ecp_tls_read_group_id( &grp_id, buf, len ) ) != 0 )
        return( ret );

    return( mbedtls_ecp_group_load( grp, grp_id ) );
}